

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::AssertionStats::~AssertionStats(AssertionStats *this)

{
  pointer pcVar1;
  
  this->_vptr_AssertionStats = (_func_int **)&PTR__AssertionStats_0019fc10;
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::~vector
            (&this->infoMessages);
  pcVar1 = (this->assertionResult).m_resultData.reconstructedExpression._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->assertionResult).m_resultData.reconstructedExpression.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->assertionResult).m_resultData.message._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->assertionResult).m_resultData.message.field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

AssertionStats::~AssertionStats() = default;